

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O0

QPDFNameTreeObjectHelper *
QPDFNameTreeObjectHelper::newEmpty
          (QPDFNameTreeObjectHelper *__return_storage_ptr__,QPDF *qpdf,bool auto_repair)

{
  QPDFObjectHandle local_40;
  QPDFObjectHandle local_30;
  byte local_19;
  QPDF *pQStack_18;
  bool auto_repair_local;
  QPDF *qpdf_local;
  
  local_19 = auto_repair;
  pQStack_18 = qpdf;
  qpdf_local = (QPDF *)__return_storage_ptr__;
  operator____qpdf((char *)&local_40,0x42b7f8);
  QPDF::makeIndirectObject((QPDF *)&local_30,(QPDFObjectHandle *)qpdf);
  QPDFNameTreeObjectHelper(__return_storage_ptr__,&local_30,pQStack_18,(bool)(local_19 & 1));
  QPDFObjectHandle::~QPDFObjectHandle(&local_30);
  QPDFObjectHandle::~QPDFObjectHandle(&local_40);
  return __return_storage_ptr__;
}

Assistant:

QPDFNameTreeObjectHelper
QPDFNameTreeObjectHelper::newEmpty(QPDF& qpdf, bool auto_repair)
{
    return {qpdf.makeIndirectObject("<< /Names [] >>"_qpdf), qpdf, auto_repair};
}